

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_file_utilities.cpp
# Opt level: O1

ON_wString __thiscall
ON_FileSystemPath::CombinePaths
          (ON_FileSystemPath *this,wchar_t *left_side,bool bLeftSideContainsFileName,
          wchar_t *right_side,bool bRightSideContainsFileName,bool bAppendTrailingDirectorySeparator
          )

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  wchar_t *pwVar4;
  undefined7 in_register_00000011;
  wchar_t directory_separator;
  ON_wString tmp;
  ON_wString rhs;
  ON_wString lhs;
  ON_wString rhs_fname;
  ON_wString rhs_volume;
  ON_wString lhs_fname;
  wchar_t *dir;
  
  ON_wString::ON_wString(&lhs_fname);
  if ((int)CONCAT71(in_register_00000011,bLeftSideContainsFileName) == 0) {
    CleanPath((ON_FileSystemPath *)&lhs,true,true,true,true,false,L'/',left_side);
  }
  else {
    RemoveFileName((ON_FileSystemPath *)&lhs,left_side,&lhs_fname);
  }
  ON_wString::ON_wString(&rhs_fname);
  if (bRightSideContainsFileName) {
    RemoveFileName((ON_FileSystemPath *)&rhs,right_side,&rhs_fname);
  }
  else {
    CleanPath((ON_FileSystemPath *)&rhs,true,true,true,true,false,L'/',right_side);
  }
  ON_wString::ON_wString(&rhs_volume);
  bVar1 = ON_wString::IsNotEmpty(&lhs);
  if (bVar1) {
    pwVar4 = ON_wString::operator_cast_to_wchar_t_(&rhs);
    RemoveVolumeName((ON_FileSystemPath *)&tmp,pwVar4,&rhs_volume);
    ON_wString::operator=(&rhs,&tmp);
    ON_wString::~ON_wString(&tmp);
  }
  bVar1 = ON_wString::IsNotEmpty(&rhs);
  if (bVar1) {
    pwVar4 = ON_wString::operator[](&rhs,0);
    if ((*pwVar4 == L'/') || (*pwVar4 == L'\\')) {
      pwVar4 = ON_wString::operator_cast_to_wchar_t_(&rhs);
      ON_wString::ON_wString(&tmp,pwVar4 + 1);
      ON_wString::operator=(&rhs,&tmp);
      ON_wString::~ON_wString(&tmp);
    }
  }
  ON_wString::ON_wString((ON_wString *)this,&lhs);
  bVar1 = ON_wString::IsNotEmpty((ON_wString *)this);
  if (bVar1) {
    iVar3 = ON_wString::Length((ON_wString *)this);
    pwVar4 = ON_wString::operator[]((ON_wString *)this,iVar3 + -1);
    bVar1 = *pwVar4 == L'\\' || *pwVar4 == L'/';
  }
  else {
    bVar1 = false;
  }
  bVar2 = ON_wString::IsNotEmpty(&rhs);
  if (bVar2) {
    bVar2 = ON_wString::IsNotEmpty((ON_wString *)this);
    if (bVar1 == false && bVar2) {
      ON_wString::operator+=((ON_wString *)this,L'/');
    }
    ON_wString::operator+=((ON_wString *)this,&rhs);
    bVar1 = ON_wString::IsNotEmpty(&lhs);
    if (bVar1) {
      pwVar4 = ON_wString::operator_cast_to_wchar_t_(&rhs);
      if ((pwVar4 != (wchar_t *)0x0) && (*pwVar4 == L'.')) {
        if ((pwVar4[(ulong)(pwVar4[1] == L'.') + 1] == L'/') ||
           (pwVar4[(ulong)(pwVar4[1] == L'.') + 1] == L'\\')) {
          pwVar4 = ON_wString::operator_cast_to_wchar_t_((ON_wString *)this);
          CleanPath((ON_FileSystemPath *)&tmp,true,true,true,true,false,L'/',pwVar4);
          ON_wString::operator=((ON_wString *)this,&tmp);
          ON_wString::~ON_wString(&tmp);
        }
      }
    }
    bVar1 = ON_wString::IsNotEmpty((ON_wString *)this);
    if (bVar1) {
      iVar3 = ON_wString::Length((ON_wString *)this);
      pwVar4 = ON_wString::operator[]((ON_wString *)this,iVar3 + -1);
      bVar1 = *pwVar4 == L'\\' || *pwVar4 == L'/';
    }
    else {
      bVar1 = false;
    }
  }
  bVar2 = ON_wString::IsNotEmpty((ON_wString *)this);
  if (bVar2) {
    bVar2 = ON_wString::IsNotEmpty(&rhs_fname);
    bAppendTrailingDirectorySeparator = bVar2 || bAppendTrailingDirectorySeparator;
  }
  if (bVar1 != bAppendTrailingDirectorySeparator) {
    if (bAppendTrailingDirectorySeparator == false) {
      if (bVar1 != false) {
        iVar3 = ON_wString::Length((ON_wString *)this);
        ON_wString::SetLength((ON_wString *)this,(long)(iVar3 + -1));
      }
    }
    else {
      tmp.m_s = (wchar_t *)0x0;
      dir = (wchar_t *)0x0;
      pwVar4 = ON_wString::operator_cast_to_wchar_t_((ON_wString *)this);
      on_wsplitpath(pwVar4,&tmp.m_s,&dir,(wchar_t **)0x0,(wchar_t **)0x0);
      if (dir != (wchar_t *)0x0) {
        iVar3 = ON_wString::Length((ON_wString *)this);
        pwVar4 = ON_wString::operator[]((ON_wString *)this,iVar3 + -1);
        if ((*pwVar4 != L'/') && (*pwVar4 != L'\\')) {
          ON_wString::operator+=((ON_wString *)this,L'/');
        }
      }
    }
  }
  ON_wString::operator+=((ON_wString *)this,&rhs_fname);
  ON_wString::~ON_wString(&rhs_volume);
  ON_wString::~ON_wString(&rhs);
  ON_wString::~ON_wString(&rhs_fname);
  ON_wString::~ON_wString(&lhs);
  ON_wString::~ON_wString(&lhs_fname);
  return (ON_wString)(wchar_t *)this;
}

Assistant:

const ON_wString ON_FileSystemPath::CombinePaths(
  const wchar_t* left_side,
  bool bLeftSideContainsFileName,
  const wchar_t* right_side,
  bool bRightSideContainsFileName,
  bool bAppendTrailingDirectorySeparator
)
{
  ON_wString lhs_fname;
  ON_wString lhs
    = bLeftSideContainsFileName
    ? ON_FileSystemPath::RemoveFileName(left_side,&lhs_fname)
    : ON_FileSystemPath::CleanPath(left_side);

  ON_wString rhs_fname;
  ON_wString rhs 
    = bRightSideContainsFileName
    ? ON_FileSystemPath::RemoveFileName(right_side,&rhs_fname)
    : ON_FileSystemPath::CleanPath(right_side);

  ON_wString rhs_volume;
  if ( lhs.IsNotEmpty() )
    rhs = ON_FileSystemPath::RemoveVolumeName(rhs, &rhs_volume);

  if (rhs.IsNotEmpty() && ON_FileSystemPath::IsDirectorySeparator(rhs[0], true))
  {
    const ON_wString tmp(static_cast<const wchar_t*>(rhs) + 1);
    rhs = tmp;
  }

  ON_wString path = lhs;
  bool bPathEndsDirectorySeparator 
    = path.IsNotEmpty()
    && ON_FileSystemPath::IsDirectorySeparator(path[path.Length() - 1], true);
  
  if (rhs.IsNotEmpty())
  {
    if (path.IsNotEmpty() && false == bPathEndsDirectorySeparator)
      path += ON_FileSystemPath::DirectorySeparator;
    path += rhs;

    if (lhs.IsNotEmpty() && ON_FileSystemPath::IsRelativePath(rhs))
      path = ON_FileSystemPath::CleanPath(path);

    bPathEndsDirectorySeparator 
      = path.IsNotEmpty()
      && ON_FileSystemPath::IsDirectorySeparator(path[path.Length() - 1], true);
  }

  if (path.IsNotEmpty() && rhs_fname.IsNotEmpty())
    bAppendTrailingDirectorySeparator = true;

  if ((bPathEndsDirectorySeparator ? 0 : 1) != (bAppendTrailingDirectorySeparator ? 0 : 1))
  {
    if (bAppendTrailingDirectorySeparator)
    {
      const wchar_t* vol = nullptr;
      const wchar_t* dir = nullptr;
      // on_wsplitpath is called to avoid appending a directory separator to a 
      on_wsplitpath(static_cast<const wchar_t*>(path), &vol, &dir, nullptr, nullptr);
      if (nullptr != dir && false == ON_FileSystemPath::IsDirectorySeparator(path[path.Length() - 1], true))
        path += ON_FileSystemPath::DirectorySeparator;
    }
    else if ( bPathEndsDirectorySeparator )
    {
      path.SetLength(path.Length() - 1);
    }
  }

  path += rhs_fname;

  return path;
}